

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O2

size_t bpkiCSRDec(bpki_csr_info_t *ci,octet *csr,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  octet *poVar4;
  octet *poVar5;
  der_anchor_t AlgId [1];
  der_anchor_t SPKI [1];
  der_anchor_t CertReqInfo [1];
  der_anchor_t CertReq [1];
  
  sVar1 = derTSEQDecStart(CertReq,csr,count,0x30);
  poVar5 = (octet *)0xffffffffffffffff;
  if (sVar1 != 0xffffffffffffffff) {
    poVar4 = csr + sVar1;
    ci->body_offset = sVar1;
    sVar2 = derTSEQDecStart(CertReqInfo,poVar4,count - sVar1,0x30);
    if (sVar2 != 0xffffffffffffffff) {
      sVar3 = (count - sVar1) - sVar2;
      poVar4 = poVar4 + sVar2;
      sVar1 = derTSIZEDec2(poVar4,sVar3,2,0);
      if (sVar1 != 0xffffffffffffffff) {
        sVar3 = sVar3 - sVar1;
        poVar4 = poVar4 + sVar1;
        sVar1 = derDec2((octet **)0x0,(size_t *)0x0,poVar4,sVar3,0x30);
        if (sVar1 != 0xffffffffffffffff) {
          sVar3 = sVar3 - sVar1;
          poVar4 = poVar4 + sVar1;
          sVar1 = derTSEQDecStart(SPKI,poVar4,sVar3,0x30);
          if (sVar1 != 0xffffffffffffffff) {
            sVar3 = sVar3 - sVar1;
            poVar4 = poVar4 + sVar1;
            sVar1 = derTSEQDecStart(AlgId,poVar4,sVar3,0x30);
            if (sVar1 != 0xffffffffffffffff) {
              sVar3 = sVar3 - sVar1;
              poVar4 = poVar4 + sVar1;
              sVar1 = derOIDDec2(poVar4,sVar3,"1.2.112.0.2.0.34.101.45.2.1");
              if (sVar1 != 0xffffffffffffffff) {
                sVar3 = sVar3 - sVar1;
                poVar4 = poVar4 + sVar1;
                sVar1 = derOIDDec2(poVar4,sVar3,"1.2.112.0.2.0.34.101.45.3.1");
                if (sVar1 != 0xffffffffffffffff) {
                  poVar4 = poVar4 + sVar1;
                  sVar2 = derTSEQDecStop(poVar4,AlgId);
                  if (sVar2 != 0xffffffffffffffff) {
                    sVar3 = sVar3 - (sVar1 + sVar2);
                    sVar1 = derTBITDec2((octet *)0x0,poVar4 + sVar2,sVar3,3,0x200);
                    if (sVar1 != 0xffffffffffffffff) {
                      poVar4 = poVar4 + sVar2 + sVar1;
                      ci->pubkey_offset = (size_t)(poVar4 + (-0x40 - (long)csr));
                      sVar2 = derTSEQDecStop(poVar4,SPKI);
                      if (sVar2 != 0xffffffffffffffff) {
                        sVar3 = sVar3 - (sVar1 + sVar2);
                        poVar4 = poVar4 + sVar2;
                        sVar1 = derDec2((octet **)0x0,(size_t *)0x0,poVar4,sVar3,0xa0);
                        if (sVar1 != 0xffffffffffffffff) {
                          sVar2 = derTSEQDecStop(poVar4 + sVar1,CertReqInfo);
                          if (sVar2 != 0xffffffffffffffff) {
                            sVar3 = sVar3 - (sVar1 + sVar2);
                            poVar4 = poVar4 + sVar1 + sVar2;
                            ci->body_len = (long)poVar4 - (long)(csr + ci->body_offset);
                            sVar1 = derTSEQDecStart(AlgId,poVar4,sVar3,0x30);
                            if (sVar1 != 0xffffffffffffffff) {
                              sVar3 = sVar3 - sVar1;
                              poVar4 = poVar4 + sVar1;
                              sVar1 = derOIDDec2(poVar4,sVar3,"1.2.112.0.2.0.34.101.45.12");
                              if (sVar1 != 0xffffffffffffffff) {
                                sVar3 = sVar3 - sVar1;
                                poVar4 = poVar4 + sVar1;
                                sVar1 = derDec4(poVar4,sVar3,5,(void *)0x0,0);
                                if (sVar1 != 0xffffffffffffffff) {
                                  poVar4 = poVar4 + sVar1;
                                  sVar2 = derTSEQDecStop(poVar4,AlgId);
                                  if (sVar2 != 0xffffffffffffffff) {
                                    sVar1 = derTBITDec2((octet *)0x0,poVar4 + sVar2,
                                                        sVar3 - (sVar1 + sVar2),3,0x180);
                                    if (sVar1 != 0xffffffffffffffff) {
                                      poVar4 = poVar4 + sVar2 + sVar1;
                                      ci->sig_offset = (size_t)(poVar4 + (-0x30 - (long)csr));
                                      sVar1 = derTSEQDecStop(poVar4,CertReq);
                                      if (sVar1 != 0xffffffffffffffff) {
                                        poVar5 = poVar4 + (sVar1 - (long)csr);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)poVar5;
}

Assistant:

static size_t bpkiCSRDec(bpki_csr_info_t* ci, const octet csr[], size_t count)
{
	der_anchor_t CertReq[1];
	der_anchor_t CertReqInfo[1];
	der_anchor_t SPKI[1];
	der_anchor_t AlgId[1];
	const octet* ptr = csr;
	// pre
	ASSERT(memIsValid(ci, sizeof(bpki_csr_info_t)));
	ASSERT(memIsValid(csr, count));
	// декодировать
	derDecStep(derSEQDecStart(CertReq, ptr, count), ptr, count);
	 ci->body_offset = ptr - csr;
	 derDecStep(derSEQDecStart(CertReqInfo, ptr, count), ptr, count);
	  derDecStep(derSIZEDec2(ptr, count, 0), ptr, count);
	  derDecStep(derDec2(0, 0, ptr, count, 0x30), ptr, count);
	  derDecStep(derSEQDecStart(SPKI, ptr, count), ptr, count);
	   derDecStep(derSEQDecStart(AlgId, ptr, count), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_bign_pubkey), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_bign_curve256v1), ptr, count);
	   derDecStep(derSEQDecStop(ptr, AlgId), ptr, count);
	   derDecStep(derBITDec2(0, ptr, count, 512), ptr, count);
	   ci->pubkey_offset = ptr - csr - 64;
	  derDecStep(derSEQDecStop(ptr, SPKI), ptr, count);
	  derDecStep(derDec2(0, 0, ptr, count, 0xA0), ptr, count);
	 derDecStep(derSEQDecStop(ptr, CertReqInfo), ptr, count);
	 ci->body_len = ptr - csr - ci->body_offset;
	 derDecStep(derSEQDecStart(AlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_bign_with_hbelt), ptr, count);
	  derDecStep(derNULLDec(ptr, count), ptr, count);
     derDecStep(derSEQDecStop(ptr, AlgId), ptr, count);
	 derDecStep(derBITDec2(0, ptr, count, 384), ptr, count);
	 ci->sig_offset = ptr - csr - 48;
	derDecStep(derSEQDecStop(ptr, CertReq), ptr, count);
	// возвратить точную длину DER-кода
	return ptr - csr;
}